

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  float *pfVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  _func_int **pp_Var19;
  ulong uVar20;
  undefined4 uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  ulong *puVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [64];
  vint4 ai;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  vint4 ai_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  vint4 ai_3;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi_1;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  vint4 bi_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai_2;
  vint4 bi_2;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  vint<4> mask;
  vint4 bi_8;
  vint<4> octant;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  AccelData *local_26b8;
  ulong local_26b0;
  RayHitK<4> *local_26a8;
  RayQueryContext *local_26a0;
  long local_2698;
  long local_2690;
  ulong local_2688;
  ulong local_2680;
  ulong local_2678;
  undefined1 local_2670 [16];
  RTCIntersectFunctionNArguments local_2660;
  Geometry *local_2630;
  undefined8 local_2628;
  RTCIntersectArguments *local_2620;
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined4 uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  undefined4 uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [8];
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [8];
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [8];
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  undefined4 uStack_23c4;
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  auVar28 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar29 = vpcmpeqd_avx(auVar28,(undefined1  [16])valid_i->field_0);
  uVar16 = vmovmskps_avx(auVar29);
  if (uVar16 == 0) {
    return;
  }
  local_26b8 = This->ptr;
  local_26b0 = (ulong)(uVar16 & 0xff);
  auVar61 = ZEXT1664(*(undefined1 (*) [16])ray);
  auVar62 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
  auVar63 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
  auVar40 = *(undefined1 (*) [16])(ray + 0x40);
  auVar43._8_4_ = 0x7fffffff;
  auVar43._0_8_ = 0x7fffffff7fffffff;
  auVar43._12_4_ = 0x7fffffff;
  auVar39 = vandps_avx(auVar40,auVar43);
  auVar54._8_4_ = 0x219392ef;
  auVar54._0_8_ = 0x219392ef219392ef;
  auVar54._12_4_ = 0x219392ef;
  auVar39 = vcmpps_avx(auVar39,auVar54,1);
  auVar45 = vblendvps_avx(auVar40,auVar54,auVar39);
  auVar39 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar43);
  auVar39 = vcmpps_avx(auVar39,auVar54,1);
  auVar44 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar54,auVar39);
  auVar39 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar43);
  auVar39 = vcmpps_avx(auVar39,auVar54,1);
  auVar39 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar54,auVar39);
  auVar43 = vrcpps_avx(auVar45);
  fVar5 = auVar43._0_4_;
  auVar49._0_4_ = auVar45._0_4_ * fVar5;
  fVar6 = auVar43._4_4_;
  auVar49._4_4_ = auVar45._4_4_ * fVar6;
  fVar7 = auVar43._8_4_;
  auVar49._8_4_ = auVar45._8_4_ * fVar7;
  fVar8 = auVar43._12_4_;
  auVar49._12_4_ = auVar45._12_4_ * fVar8;
  auVar58._8_4_ = 0x3f800000;
  auVar58._0_8_ = &DAT_3f8000003f800000;
  auVar58._12_4_ = 0x3f800000;
  auVar45 = vsubps_avx(auVar58,auVar49);
  local_25c0._0_4_ = fVar5 + fVar5 * auVar45._0_4_;
  local_25c0._4_4_ = fVar6 + fVar6 * auVar45._4_4_;
  local_25c0._8_4_ = fVar7 + fVar7 * auVar45._8_4_;
  local_25c0._12_4_ = fVar8 + fVar8 * auVar45._12_4_;
  auVar64 = ZEXT1664(local_25c0);
  auVar45 = vrcpps_avx(auVar44);
  fVar5 = auVar45._0_4_;
  auVar55._0_4_ = auVar44._0_4_ * fVar5;
  fVar6 = auVar45._4_4_;
  auVar55._4_4_ = auVar44._4_4_ * fVar6;
  fVar7 = auVar45._8_4_;
  auVar55._8_4_ = auVar44._8_4_ * fVar7;
  fVar8 = auVar45._12_4_;
  auVar55._12_4_ = auVar44._12_4_ * fVar8;
  auVar45 = vsubps_avx(auVar58,auVar55);
  local_25d0._0_4_ = fVar5 + fVar5 * auVar45._0_4_;
  local_25d0._4_4_ = fVar6 + fVar6 * auVar45._4_4_;
  local_25d0._8_4_ = fVar7 + fVar7 * auVar45._8_4_;
  local_25d0._12_4_ = fVar8 + fVar8 * auVar45._12_4_;
  auVar65 = ZEXT1664(local_25d0);
  auVar45 = vrcpps_avx(auVar39);
  fVar5 = auVar45._0_4_;
  auVar44._0_4_ = auVar39._0_4_ * fVar5;
  fVar6 = auVar45._4_4_;
  auVar44._4_4_ = auVar39._4_4_ * fVar6;
  fVar7 = auVar45._8_4_;
  auVar44._8_4_ = auVar39._8_4_ * fVar7;
  fVar8 = auVar45._12_4_;
  auVar44._12_4_ = auVar39._12_4_ * fVar8;
  auVar39 = vsubps_avx(auVar58,auVar44);
  local_25e0._0_4_ = fVar5 + fVar5 * auVar39._0_4_;
  local_25e0._4_4_ = fVar6 + fVar6 * auVar39._4_4_;
  local_25e0._8_4_ = fVar7 + fVar7 * auVar39._8_4_;
  local_25e0._12_4_ = fVar8 + fVar8 * auVar39._12_4_;
  auVar66 = ZEXT1664(local_25e0);
  auVar45 = ZEXT816(0) << 0x20;
  local_25f0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar45);
  local_2600 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar45);
  auVar40 = vcmpps_avx(auVar40,auVar45,1);
  auVar39._8_4_ = 1;
  auVar39._0_8_ = 0x100000001;
  auVar39._12_4_ = 1;
  auVar40 = vandps_avx(auVar40,auVar39);
  auVar39 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar45,1);
  auVar50._8_4_ = 2;
  auVar50._0_8_ = 0x200000002;
  auVar50._12_4_ = 2;
  auVar39 = vandps_avx(auVar39,auVar50);
  auVar39 = vorps_avx(auVar39,auVar40);
  auVar40 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar45,1);
  auVar45._8_4_ = 4;
  auVar45._0_8_ = 0x400000004;
  auVar45._12_4_ = 4;
  auVar40 = vandps_avx(auVar40,auVar45);
  auVar28 = vpor_avx(auVar29 ^ auVar28,auVar40);
  local_2670 = vpor_avx(auVar28,auVar39);
  auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  local_2590 = *(undefined1 (*) [16])ray;
  local_25a0 = *(undefined1 (*) [16])(ray + 0x10);
  local_25b0 = *(undefined1 (*) [16])(ray + 0x20);
  local_26a8 = ray;
  local_26a0 = context;
LAB_00468cf8:
  lVar4 = 0;
  if (local_26b0 != 0) {
    for (; (local_26b0 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
    }
  }
  uVar21 = *(undefined4 *)(local_2670 + lVar4 * 4);
  auVar28._4_4_ = uVar21;
  auVar28._0_4_ = uVar21;
  auVar28._8_4_ = uVar21;
  auVar28._12_4_ = uVar21;
  auVar50 = vpcmpeqd_avx(auVar28,local_2670);
  uVar21 = vmovmskps_avx(auVar50);
  auVar49 = auVar60._0_16_;
  auVar28 = vblendvps_avx(auVar49,auVar64._0_16_,auVar50);
  local_26b0 = ~CONCAT44((int)((ulong)lVar4 >> 0x20),uVar21) & local_26b0;
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar29,auVar28);
  auVar29 = vshufpd_avx(auVar28,auVar28,1);
  auVar29 = vminps_avx(auVar29,auVar28);
  auVar28 = vblendvps_avx(auVar49,auVar65._0_16_,auVar50);
  auVar40 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar40,auVar28);
  auVar40 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vminps_avx(auVar40,auVar28);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar49,auVar66._0_16_,auVar50);
  auVar40 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vminps_avx(auVar40,auVar28);
  auVar40 = vshufpd_avx(auVar28,auVar28,1);
  auVar40 = vminps_avx(auVar40,auVar28);
  auVar59._8_4_ = 0xff800000;
  auVar59._0_8_ = 0xff800000ff800000;
  auVar59._12_4_ = 0xff800000;
  auVar28 = vblendvps_avx(auVar59,auVar64._0_16_,auVar50);
  auVar45 = vinsertps_avx(auVar29,auVar40,0x20);
  auVar29 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar29,auVar28);
  auVar29 = vshufpd_avx(auVar28,auVar28,1);
  auVar29 = vmaxps_avx(auVar29,auVar28);
  auVar28 = vblendvps_avx(auVar59,auVar65._0_16_,auVar50);
  auVar40 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar40,auVar28);
  auVar40 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar40,auVar28);
  auVar29 = vinsertps_avx(auVar29,auVar28,0x1c);
  auVar28 = vblendvps_avx(auVar59,auVar66._0_16_,auVar50);
  auVar40 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar28 = vmaxps_avx(auVar40,auVar28);
  auVar40 = vshufpd_avx(auVar28,auVar28,1);
  auVar28 = vmaxps_avx(auVar40,auVar28);
  auVar44 = vinsertps_avx(auVar29,auVar28,0x20);
  auVar39 = vcmpps_avx(auVar45,_DAT_01feba10,5);
  auVar28 = vblendvps_avx(auVar44,auVar45,auVar39);
  auVar29 = vmovshdup_avx(auVar28);
  local_2678 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
  auVar29 = vshufpd_avx(auVar28,auVar28,1);
  uVar24 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x80;
  local_2680 = local_2678 ^ 0x20;
  auVar29 = vblendvps_avx(auVar49,auVar61._0_16_,auVar50);
  auVar40 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vminps_avx(auVar40,auVar29);
  auVar40 = vshufpd_avx(auVar29,auVar29,1);
  auVar40 = vminps_avx(auVar40,auVar29);
  auVar29 = vblendvps_avx(auVar49,auVar62._0_16_,auVar50);
  auVar43 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vminps_avx(auVar43,auVar29);
  auVar43 = vshufpd_avx(auVar29,auVar29,1);
  auVar43 = vminps_avx(auVar43,auVar29);
  auVar29 = vblendvps_avx(auVar49,auVar63._0_16_,auVar50);
  auVar40 = vinsertps_avx(auVar40,auVar43,0x1c);
  auVar43 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vminps_avx(auVar43,auVar29);
  auVar43 = vshufpd_avx(auVar29,auVar29,1);
  auVar29 = vminps_avx(auVar43,auVar29);
  auVar40 = vinsertps_avx(auVar40,auVar29,0x20);
  auVar29 = vblendvps_avx(auVar59,auVar61._0_16_,auVar50);
  auVar43 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vmaxps_avx(auVar43,auVar29);
  auVar43 = vshufpd_avx(auVar29,auVar29,1);
  auVar43 = vmaxps_avx(auVar43,auVar29);
  auVar29 = vblendvps_avx(auVar59,auVar62._0_16_,auVar50);
  auVar49 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vmaxps_avx(auVar49,auVar29);
  auVar49 = vshufpd_avx(auVar29,auVar29,1);
  auVar49 = vmaxps_avx(auVar49,auVar29);
  auVar29 = vblendvps_avx(auVar59,auVar63._0_16_,auVar50);
  auVar43 = vinsertps_avx(auVar43,auVar49,0x1c);
  auVar49 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar29 = vmaxps_avx(auVar49,auVar29);
  auVar49 = vshufpd_avx(auVar29,auVar29,1);
  auVar29 = vmaxps_avx(auVar49,auVar29);
  auVar43 = vinsertps_avx(auVar43,auVar29,0x20);
  auVar29 = vblendvps_avx(auVar43,auVar40,auVar39);
  auVar40 = vblendvps_avx(auVar40,auVar43,auVar39);
  local_26d0 = vblendvps_avx(auVar59,local_2600,auVar50);
  auVar43 = vshufps_avx(local_26d0,local_26d0,0xb1);
  auVar43 = vmaxps_avx(auVar43,local_26d0);
  auVar54 = vshufpd_avx(auVar43,auVar43,1);
  auVar51._8_4_ = 0x7f800000;
  auVar51._0_8_ = 0x7f8000007f800000;
  auVar51._12_4_ = 0x7f800000;
  local_2570 = vblendvps_avx(auVar51,local_25f0,auVar50);
  auVar49 = vshufps_avx(local_2570,local_2570,0xb1);
  auVar49 = vminps_avx(auVar49,local_2570);
  auVar43 = vmaxss_avx(auVar54,auVar43);
  auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  auVar39 = vblendvps_avx(auVar45,auVar44,auVar39);
  auVar46._0_4_ = auVar40._0_4_ * auVar28._0_4_;
  auVar46._4_4_ = auVar40._4_4_ * auVar28._4_4_;
  auVar46._8_4_ = auVar40._8_4_ * auVar28._8_4_;
  auVar46._12_4_ = auVar40._12_4_ * auVar28._12_4_;
  auVar40._0_4_ = auVar29._0_4_ * auVar39._0_4_;
  auVar40._4_4_ = auVar29._4_4_ * auVar39._4_4_;
  auVar40._8_4_ = auVar29._8_4_ * auVar39._8_4_;
  auVar40._12_4_ = auVar29._12_4_ * auVar39._12_4_;
  local_2688 = (ulong)(auVar28._0_4_ < 0.0) << 5;
  uVar20 = local_2688 ^ 0x20;
  local_23a0 = *(ulong *)&local_26b8[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  auVar29 = vshufps_avx(auVar28,auVar28,0);
  register0x00001390 = auVar29;
  _local_23e0 = auVar29;
  auVar29 = vshufps_avx(auVar46,auVar46,0);
  local_2400._16_16_ = auVar29;
  local_2400._0_16_ = auVar29;
  auVar29 = vshufps_avx(auVar28,auVar28,0x55);
  register0x00001390 = auVar29;
  _local_2420 = auVar29;
  auVar29 = vshufps_avx(auVar46,auVar46,0x55);
  local_2440._16_16_ = auVar29;
  local_2440._0_16_ = auVar29;
  auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
  register0x00001250 = auVar28;
  _local_2460 = auVar28;
  auVar28 = vshufps_avx(auVar46,auVar46,0xaa);
  local_2480._16_16_ = auVar28;
  local_2480._0_16_ = auVar28;
  auVar28 = vshufps_avx(auVar39,auVar39,0);
  register0x00001250 = auVar28;
  _local_24a0 = auVar28;
  auVar28 = vshufps_avx(auVar40,auVar40,0);
  local_24c0._16_16_ = auVar28;
  local_24c0._0_16_ = auVar28;
  auVar28 = vshufps_avx(auVar39,auVar39,0x55);
  register0x00001250 = auVar28;
  _local_24e0 = auVar28;
  auVar28 = vshufps_avx(auVar49,auVar49,0);
  auVar29 = vshufps_avx(auVar49,auVar49,0xaa);
  auVar28 = vminps_avx(auVar29,auVar28);
  auVar29 = vshufps_avx(auVar40,auVar40,0x55);
  local_2500._16_16_ = auVar29;
  local_2500._0_16_ = auVar29;
  auVar29 = vshufps_avx(auVar39,auVar39,0xaa);
  register0x00001290 = auVar29;
  _local_2520 = auVar29;
  auVar29 = vshufps_avx(auVar40,auVar40,0xaa);
  local_2540._16_16_ = auVar29;
  local_2540._0_16_ = auVar29;
  local_2560._16_16_ = auVar28;
  local_2560._0_16_ = auVar28;
  puVar26 = local_2390;
  do {
    auVar28 = vshufps_avx(auVar43,auVar43,0);
    local_23c0._16_16_ = auVar28;
    local_23c0._0_16_ = auVar28;
LAB_00469097:
    do {
      do {
        puVar25 = puVar26;
        if (puVar25 == &local_23a0) {
          if (local_26b0 == 0) {
            return;
          }
          goto LAB_00468cf8;
        }
        puVar26 = puVar25 + -2;
        uVar21 = (undefined4)puVar25[-1];
        auVar29._4_4_ = uVar21;
        auVar29._0_4_ = uVar21;
        auVar29._8_4_ = uVar21;
        auVar29._12_4_ = uVar21;
        auVar31 = ZEXT1664(auVar29);
        auVar28 = vcmpps_avx(auVar29,local_26d0,1);
      } while ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar28[0xf]);
      uVar27 = puVar25[-2];
      while ((uVar27 & 8) == 0) {
        pfVar3 = (float *)(uVar27 + 0x40 + local_2688);
        auVar9._4_4_ = (float)local_23e0._4_4_ * pfVar3[1];
        auVar9._0_4_ = (float)local_23e0._0_4_ * *pfVar3;
        auVar9._8_4_ = fStack_23d8 * pfVar3[2];
        auVar9._12_4_ = fStack_23d4 * pfVar3[3];
        auVar9._16_4_ = fStack_23d0 * pfVar3[4];
        auVar9._20_4_ = fStack_23cc * pfVar3[5];
        auVar9._24_4_ = fStack_23c8 * pfVar3[6];
        auVar9._28_4_ = uStack_23c4;
        pfVar3 = (float *)(uVar27 + 0x40 + local_2678);
        auVar10._4_4_ = (float)local_2420._4_4_ * pfVar3[1];
        auVar10._0_4_ = (float)local_2420._0_4_ * *pfVar3;
        auVar10._8_4_ = fStack_2418 * pfVar3[2];
        auVar10._12_4_ = fStack_2414 * pfVar3[3];
        auVar10._16_4_ = fStack_2410 * pfVar3[4];
        auVar10._20_4_ = fStack_240c * pfVar3[5];
        auVar10._24_4_ = fStack_2408 * pfVar3[6];
        auVar10._28_4_ = uStack_2404;
        auVar9 = vsubps_avx(auVar9,local_2400);
        auVar10 = vsubps_avx(auVar10,local_2440);
        pfVar3 = (float *)(uVar27 + 0x40 + uVar24);
        auVar11._4_4_ = (float)local_2460._4_4_ * pfVar3[1];
        auVar11._0_4_ = (float)local_2460._0_4_ * *pfVar3;
        auVar11._8_4_ = fStack_2458 * pfVar3[2];
        auVar11._12_4_ = fStack_2454 * pfVar3[3];
        auVar11._16_4_ = fStack_2450 * pfVar3[4];
        auVar11._20_4_ = fStack_244c * pfVar3[5];
        auVar11._24_4_ = fStack_2448 * pfVar3[6];
        auVar11._28_4_ = uStack_2444;
        auVar11 = vsubps_avx(auVar11,local_2480);
        pfVar3 = (float *)(uVar27 + 0x40 + uVar20);
        auVar12._4_4_ = (float)local_24a0._4_4_ * pfVar3[1];
        auVar12._0_4_ = (float)local_24a0._0_4_ * *pfVar3;
        auVar12._8_4_ = fStack_2498 * pfVar3[2];
        auVar12._12_4_ = fStack_2494 * pfVar3[3];
        auVar12._16_4_ = fStack_2490 * pfVar3[4];
        auVar12._20_4_ = fStack_248c * pfVar3[5];
        auVar12._24_4_ = fStack_2488 * pfVar3[6];
        auVar12._28_4_ = uStack_2484;
        auVar12 = vsubps_avx(auVar12,local_24c0);
        auVar28 = vpmaxsd_avx(auVar9._0_16_,auVar10._0_16_);
        auVar29 = vpmaxsd_avx(auVar9._16_16_,auVar10._16_16_);
        auVar40 = vpmaxsd_avx(auVar11._0_16_,local_2560._0_16_);
        auVar28 = vpmaxsd_avx(auVar28,auVar40);
        auVar40 = vpmaxsd_avx(auVar11._16_16_,local_2560._16_16_);
        pfVar3 = (float *)(uVar27 + 0x40 + local_2680);
        auVar13._4_4_ = (float)local_24e0._4_4_ * pfVar3[1];
        auVar13._0_4_ = (float)local_24e0._0_4_ * *pfVar3;
        auVar13._8_4_ = fStack_24d8 * pfVar3[2];
        auVar13._12_4_ = fStack_24d4 * pfVar3[3];
        auVar13._16_4_ = fStack_24d0 * pfVar3[4];
        auVar13._20_4_ = fStack_24cc * pfVar3[5];
        auVar13._24_4_ = fStack_24c8 * pfVar3[6];
        auVar13._28_4_ = uStack_24c4;
        auVar9 = vsubps_avx(auVar13,local_2500);
        auVar29 = vpmaxsd_avx(auVar29,auVar40);
        pfVar3 = (float *)(uVar27 + 0x40 + (uVar24 ^ 0x20));
        auVar14._4_4_ = (float)local_2520._4_4_ * pfVar3[1];
        auVar14._0_4_ = (float)local_2520._0_4_ * *pfVar3;
        auVar14._8_4_ = fStack_2518 * pfVar3[2];
        auVar14._12_4_ = fStack_2514 * pfVar3[3];
        auVar14._16_4_ = fStack_2510 * pfVar3[4];
        auVar14._20_4_ = fStack_250c * pfVar3[5];
        auVar14._24_4_ = fStack_2508 * pfVar3[6];
        auVar14._28_4_ = uStack_2504;
        auVar10 = vsubps_avx(auVar14,local_2540);
        auVar35._16_16_ = auVar29;
        auVar35._0_16_ = auVar28;
        auVar40 = vpminsd_avx(auVar12._0_16_,auVar9._0_16_);
        auVar39 = vpminsd_avx(auVar12._16_16_,auVar9._16_16_);
        auVar45 = vpminsd_avx(auVar10._0_16_,local_23c0._0_16_);
        auVar40 = vpminsd_avx(auVar40,auVar45);
        auVar45 = vpminsd_avx(auVar10._16_16_,local_23c0._16_16_);
        auVar39 = vpminsd_avx(auVar39,auVar45);
        auVar38._16_16_ = auVar39;
        auVar38._0_16_ = auVar40;
        local_2660.valid = (int *)auVar28._0_8_;
        local_2660.geometryUserPtr = (void *)auVar28._8_8_;
        local_2660.primID = auVar29._0_4_;
        local_2660._20_4_ = auVar29._4_4_;
        local_2660.context = (RTCRayQueryContext *)auVar29._8_8_;
        auVar9 = vcmpps_avx(auVar35,auVar38,2);
        uVar16 = vmovmskps_avx(auVar9);
        if (uVar16 == 0) {
          bVar15 = false;
          uVar18 = uVar27;
        }
        else {
          uVar22 = (ulong)(uVar16 & 0xff);
          auVar31 = ZEXT1664(auVar60._0_16_);
          uVar23 = 0;
          uVar17 = 8;
          do {
            lVar4 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar21 = *(undefined4 *)(uVar27 + 0x40 + lVar4 * 4);
            auVar32._4_4_ = uVar21;
            auVar32._0_4_ = uVar21;
            auVar32._8_4_ = uVar21;
            auVar32._12_4_ = uVar21;
            auVar28 = vsubps_avx(auVar32,auVar61._0_16_);
            auVar33._0_4_ = auVar64._0_4_ * auVar28._0_4_;
            auVar33._4_4_ = auVar64._4_4_ * auVar28._4_4_;
            auVar33._8_4_ = auVar64._8_4_ * auVar28._8_4_;
            auVar33._12_4_ = auVar64._12_4_ * auVar28._12_4_;
            uVar21 = *(undefined4 *)(uVar27 + 0x80 + lVar4 * 4);
            auVar36._4_4_ = uVar21;
            auVar36._0_4_ = uVar21;
            auVar36._8_4_ = uVar21;
            auVar36._12_4_ = uVar21;
            auVar28 = vsubps_avx(auVar36,auVar62._0_16_);
            auVar37._0_4_ = auVar65._0_4_ * auVar28._0_4_;
            auVar37._4_4_ = auVar65._4_4_ * auVar28._4_4_;
            auVar37._8_4_ = auVar65._8_4_ * auVar28._8_4_;
            auVar37._12_4_ = auVar65._12_4_ * auVar28._12_4_;
            uVar21 = *(undefined4 *)(uVar27 + 0xc0 + lVar4 * 4);
            auVar41._4_4_ = uVar21;
            auVar41._0_4_ = uVar21;
            auVar41._8_4_ = uVar21;
            auVar41._12_4_ = uVar21;
            auVar28 = vsubps_avx(auVar41,auVar63._0_16_);
            auVar42._0_4_ = auVar66._0_4_ * auVar28._0_4_;
            auVar42._4_4_ = auVar66._4_4_ * auVar28._4_4_;
            auVar42._8_4_ = auVar66._8_4_ * auVar28._8_4_;
            auVar42._12_4_ = auVar66._12_4_ * auVar28._12_4_;
            uVar21 = *(undefined4 *)(uVar27 + 0x60 + lVar4 * 4);
            auVar47._4_4_ = uVar21;
            auVar47._0_4_ = uVar21;
            auVar47._8_4_ = uVar21;
            auVar47._12_4_ = uVar21;
            auVar28 = vsubps_avx(auVar47,auVar61._0_16_);
            auVar48._0_4_ = auVar64._0_4_ * auVar28._0_4_;
            auVar48._4_4_ = auVar64._4_4_ * auVar28._4_4_;
            auVar48._8_4_ = auVar64._8_4_ * auVar28._8_4_;
            auVar48._12_4_ = auVar64._12_4_ * auVar28._12_4_;
            uVar21 = *(undefined4 *)(uVar27 + 0xa0 + lVar4 * 4);
            auVar52._4_4_ = uVar21;
            auVar52._0_4_ = uVar21;
            auVar52._8_4_ = uVar21;
            auVar52._12_4_ = uVar21;
            auVar28 = vsubps_avx(auVar52,auVar62._0_16_);
            auVar53._0_4_ = auVar65._0_4_ * auVar28._0_4_;
            auVar53._4_4_ = auVar65._4_4_ * auVar28._4_4_;
            auVar53._8_4_ = auVar65._8_4_ * auVar28._8_4_;
            auVar53._12_4_ = auVar65._12_4_ * auVar28._12_4_;
            uVar21 = *(undefined4 *)(uVar27 + 0xe0 + lVar4 * 4);
            auVar56._4_4_ = uVar21;
            auVar56._0_4_ = uVar21;
            auVar56._8_4_ = uVar21;
            auVar56._12_4_ = uVar21;
            auVar28 = vsubps_avx(auVar56,auVar63._0_16_);
            auVar57._0_4_ = auVar66._0_4_ * auVar28._0_4_;
            auVar57._4_4_ = auVar66._4_4_ * auVar28._4_4_;
            auVar57._8_4_ = auVar66._8_4_ * auVar28._8_4_;
            auVar57._12_4_ = auVar66._12_4_ * auVar28._12_4_;
            auVar28 = vpminsd_avx(auVar33,auVar48);
            auVar29 = vpminsd_avx(auVar37,auVar53);
            auVar28 = vpmaxsd_avx(auVar28,auVar29);
            auVar39 = vpminsd_avx(auVar42,auVar57);
            auVar29 = vpmaxsd_avx(auVar33,auVar48);
            auVar40 = vpmaxsd_avx(auVar37,auVar53);
            auVar45 = vpminsd_avx(auVar29,auVar40);
            auVar29 = vpmaxsd_avx(auVar42,auVar57);
            auVar40 = vpmaxsd_avx(auVar39,local_2570);
            auVar28 = vpmaxsd_avx(auVar28,auVar40);
            auVar29 = vpminsd_avx(auVar29,local_26d0);
            auVar29 = vpminsd_avx(auVar45,auVar29);
            auVar28 = vcmpps_avx(auVar28,auVar29,2);
            uVar18 = uVar17;
            if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar28[0xf] < '\0') {
              uVar21 = *(undefined4 *)((long)&local_2660.valid + lVar4 * 4);
              auVar34._4_4_ = uVar21;
              auVar34._0_4_ = uVar21;
              auVar34._8_4_ = uVar21;
              auVar34._12_4_ = uVar21;
              uVar18 = *(ulong *)(uVar27 + lVar4 * 8);
              auVar29 = auVar31._0_16_;
              auVar28 = vcmpps_avx(auVar34,auVar29,1);
              if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar28[0xf]) {
                *puVar26 = uVar18;
                uVar18 = uVar17;
              }
              else {
                if (uVar17 == 8) {
                  auVar31 = ZEXT1664(auVar34);
                  goto LAB_00469337;
                }
                *puVar26 = uVar17;
                auVar31 = ZEXT1664(auVar34);
                auVar34 = auVar29;
              }
              uVar23 = uVar23 + 1;
              *(int *)(puVar26 + 1) = auVar34._0_4_;
              puVar26 = puVar26 + 2;
            }
LAB_00469337:
            uVar22 = uVar22 & uVar22 - 1;
            uVar17 = uVar18;
          } while (uVar22 != 0);
          if (uVar18 == 8) {
            bVar15 = false;
          }
          else {
            bVar15 = true;
            if (1 < uVar23) {
              puVar25 = puVar26 + -4;
              puVar1 = puVar26 + -2;
              if ((uint)puVar26[-3] < (uint)puVar26[-1]) {
                uVar27 = *puVar25;
                uVar17 = puVar26[-3];
                *(int *)(puVar26 + -3) = (int)puVar26[-1];
                *puVar25 = *puVar1;
                *puVar1 = uVar27;
                local_26e0._8_4_ = (undefined4)uVar17;
                *(undefined4 *)(puVar26 + -1) = local_26e0._8_4_;
              }
              if (uVar23 != 2) {
                puVar2 = puVar26 + -6;
                if ((uint)puVar26[-5] < (uint)puVar26[-1]) {
                  uVar27 = *puVar2;
                  uVar17 = puVar26[-5];
                  *(int *)(puVar26 + -5) = (int)puVar26[-1];
                  *puVar2 = *puVar1;
                  *puVar1 = uVar27;
                  local_26e0._8_4_ = (undefined4)uVar17;
                  *(undefined4 *)(puVar26 + -1) = local_26e0._8_4_;
                }
                if ((uint)puVar26[-5] < (uint)puVar26[-3]) {
                  uVar27 = *puVar2;
                  uVar17 = puVar26[-5];
                  *(int *)(puVar26 + -5) = (int)puVar26[-3];
                  *puVar2 = *puVar25;
                  *puVar25 = uVar27;
                  local_26e0._8_4_ = (undefined4)uVar17;
                  *(undefined4 *)(puVar26 + -3) = local_26e0._8_4_;
                }
              }
            }
          }
        }
        uVar27 = uVar18;
        if (!bVar15) goto LAB_00469097;
      }
      auVar28 = vcmpps_avx(local_26d0,auVar31._0_16_,6);
      auVar31 = ZEXT1664(auVar28);
      if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar28[0xf])
      goto LAB_00469097;
      local_2698 = (ulong)((uint)uVar27 & 0xf) - 8;
      if (local_2698 != 0) {
        local_2690 = 0;
        local_2580 = auVar28;
        do {
          local_2660.geomID = *(uint *)((uVar27 & 0xfffffffffffffff0) + local_2690 * 8);
          local_2630 = (context->scene->geometries).items[local_2660.geomID].ptr;
          uVar16 = local_2630->mask;
          auVar30._4_4_ = uVar16;
          auVar30._0_4_ = uVar16;
          auVar30._8_4_ = uVar16;
          auVar30._12_4_ = uVar16;
          auVar28 = vandps_avx(auVar30,*(undefined1 (*) [16])(ray + 0x90));
          auVar28 = vpcmpeqd_avx(auVar28,_DAT_01feba10);
          auVar29 = auVar31._0_16_ & ~auVar28;
          if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar29[0xf] < '\0') {
            local_26e0 = vandnps_avx(auVar28,auVar31._0_16_);
            local_2660.geometryUserPtr = local_2630->userPtr;
            local_2660.valid = (int *)local_26e0;
            auVar28 = (undefined1  [16])local_2660._0_16_;
            local_2660.context = context->user;
            local_2660.N = 4;
            local_2660.primID = *(undefined4 *)((uVar27 & 0xfffffffffffffff0) + 4 + local_2690 * 8);
            local_2660._0_20_ = CONCAT416(local_2660.primID,auVar28);
            local_2628 = 0;
            local_2620 = context->args;
            pp_Var19 = (_func_int **)local_2620->intersect;
            if (pp_Var19 == (_func_int **)0x0) {
              pp_Var19 = local_2630[1].super_RefCount._vptr_RefCount;
            }
            local_2660.rayhit = (RTCRayHitN *)ray;
            (*(code *)pp_Var19)(&local_2660);
            auVar61 = ZEXT1664(local_2590);
            auVar62 = ZEXT1664(local_25a0);
            auVar63 = ZEXT1664(local_25b0);
            auVar64 = ZEXT1664(local_25c0);
            auVar65 = ZEXT1664(local_25d0);
            auVar66 = ZEXT1664(local_25e0);
            auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar31 = ZEXT1664(local_2580);
            context = local_26a0;
            ray = local_26a8;
          }
          auVar28 = auVar31._0_16_;
          local_2690 = local_2690 + 1;
        } while (local_2698 != local_2690);
      }
      auVar29 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_26d0,1);
      auVar29 = auVar28 & auVar29;
    } while ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar29[0xf]);
    local_26d0 = vblendvps_avx(local_26d0,*(undefined1 (*) [16])(ray + 0x80),auVar28);
    auVar28 = vshufps_avx(local_26d0,local_26d0,0xb1);
    auVar28 = vmaxps_avx(auVar28,local_26d0);
    auVar29 = vshufpd_avx(auVar28,auVar28,1);
    auVar43 = vmaxss_avx(auVar29,auVar28);
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }